

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

int Llb4_Nonlin4SweepCutpoints(Aig_Man_t *pAig,Vec_Int_t *vOrder,int nBddLimit,int fVerbose)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  DdManager *dd;
  Aig_Obj_t *pObj;
  DdNode *pDVar5;
  void *pvVar6;
  int iVar7;
  DdNode *g;
  Vec_Ptr_t *p;
  DdNode *f;
  ulong *puVar8;
  uint local_64;
  
  dd = Cudd_Init(pAig->vObjs->nSize,0,0x100,0x40000,0);
  Aig_ManCleanData(pAig);
  for (iVar7 = 0; iVar7 < pAig->vCis->nSize; iVar7 = iVar7 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar7);
    iVar3 = Llb_ObjBddVar(vOrder,pObj);
    pDVar5 = Cudd_bddIthVar(dd,iVar3);
    (pObj->field_5).pData = pDVar5;
  }
  iVar7 = 0;
  local_64 = 0;
  while( true ) {
    p = pAig->vObjs;
    iVar3 = p->nSize;
    if (iVar3 <= iVar7) break;
    pvVar6 = Vec_PtrEntry(p,iVar7);
    if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)) {
      f = (DdNode *)
          ((ulong)((uint)*(ulong *)((long)pvVar6 + 8) & 1) ^
          *(ulong *)((*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe) + 0x28));
      g = (DdNode *)
          ((ulong)((uint)*(ulong *)((long)pvVar6 + 0x10) & 1) ^
          *(ulong *)((*(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe) + 0x28));
      pDVar5 = Cudd_bddAnd(dd,f,g);
      Cudd_Ref(pDVar5);
      iVar3 = Cudd_DagSize(pDVar5);
      if (nBddLimit < iVar3) {
        Cudd_RecursiveDeref(dd,pDVar5);
        iVar3 = Cudd_DagSize(f);
        iVar4 = Cudd_DagSize(g);
        puVar8 = (ulong *)((long)pvVar6 + 0x10);
        if (iVar4 <= iVar3) {
          puVar8 = (ulong *)((long)pvVar6 + 8);
        }
        Cudd_RecursiveDeref(dd,*(DdNode **)((*puVar8 & 0xfffffffffffffffe) + 0x28));
        iVar3 = Llb_ObjBddVar(vOrder,(Aig_Obj_t *)(*puVar8 & 0xfffffffffffffffe));
        pDVar5 = Cudd_bddIthVar(dd,iVar3);
        *(DdNode **)((*puVar8 & 0xfffffffffffffffe) + 0x28) = pDVar5;
        Cudd_Ref(pDVar5);
        puVar8 = (ulong *)((*puVar8 & 0xfffffffffffffffe) + 0x18);
        *puVar8 = *puVar8 | 0x10;
        uVar1 = *(ulong *)((long)pvVar6 + 8);
        uVar2 = *(ulong *)((long)pvVar6 + 0x10);
        pDVar5 = Cudd_bddAnd(dd,(DdNode *)
                                ((ulong)((uint)uVar1 & 1) ^
                                *(ulong *)((uVar1 & 0xfffffffffffffffe) + 0x28)),
                             (DdNode *)
                             ((ulong)((uint)uVar2 & 1) ^
                             *(ulong *)((uVar2 & 0xfffffffffffffffe) + 0x28)));
        Cudd_Ref(pDVar5);
        local_64 = local_64 + 1;
      }
      *(DdNode **)((long)pvVar6 + 0x28) = pDVar5;
    }
    iVar7 = iVar7 + 1;
  }
  for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pvVar6 = Vec_PtrEntry(p,iVar7);
    if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)) {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar6 + 0x28));
    }
    p = pAig->vObjs;
    iVar3 = p->nSize;
  }
  Extra_StopManager(dd);
  if (fVerbose != 0) {
    printf("Added %d cut points.  Used %d high fanout points.\n",(ulong)local_64,0);
  }
  return local_64;
}

Assistant:

int Llb4_Nonlin4SweepCutpoints( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nBddLimit, int fVerbose )
{
    DdManager * dd;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Aig_Obj_t * pObj;
    int i, Counter = 0, Counter1 = 0;
    dd = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // assign elementary variables
    Aig_ManCleanData( pAig );
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // sweep internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
/*
        if ( pObj->nRefs >= 4 )
        {
            bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );  Cudd_Ref( bFunc );
            pObj->pData = bFunc;
            Counter1++;
            continue;
        }
*/
        bFunc0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );  Cudd_Ref( bFunc );
        if ( Cudd_DagSize(bFunc) > nBddLimit )
        {
//            if ( fVerbose )
//                printf( "Node %5d : Beg =%5d. ", i, Cudd_DagSize(bFunc) );

            // add cutpoint at a larger one
            Cudd_RecursiveDeref( dd, bFunc );
            if ( Cudd_DagSize(bFunc0) >= Cudd_DagSize(bFunc1) )
            {
                Cudd_RecursiveDeref( dd, (DdNode *)Aig_ObjFanin0(pObj)->pData );
                bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, Aig_ObjFanin0(pObj)) );
                Aig_ObjFanin0(pObj)->pData = bFunc;  Cudd_Ref( bFunc );
                Aig_ObjFanin0(pObj)->fMarkA = 1;

//                if ( fVerbose )
//                    printf( "Ref =%3d  ", Aig_ObjFanin0(pObj)->nRefs );
            }
            else
            {
                Cudd_RecursiveDeref( dd, (DdNode *)Aig_ObjFanin1(pObj)->pData );
                bFunc = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, Aig_ObjFanin1(pObj)) );
                Aig_ObjFanin1(pObj)->pData = bFunc;  Cudd_Ref( bFunc );
                Aig_ObjFanin1(pObj)->fMarkA = 1;

//                if ( fVerbose )
//                    printf( "Ref =%3d  ", Aig_ObjFanin1(pObj)->nRefs );
            }
            // perform new operation
            bFunc0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bFunc1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
            bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );  Cudd_Ref( bFunc );
//            assert( Cudd_DagSize(bFunc) <= nBddLimit );

//            if ( fVerbose )
//                printf( "End =%5d.\n", Cudd_DagSize(bFunc) );
            Counter++;
        }
        pObj->pData = bFunc;
//printf( "%d ", Cudd_DagSize(bFunc) );
    }
//printf( "\n" );
    // clean up
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Extra_StopManager( dd );
//    Aig_ManCleanMarkA( pAig );
    if ( fVerbose )
    printf( "Added %d cut points.  Used %d high fanout points.\n", Counter, Counter1 );
    return Counter + Counter1;
}